

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void * get_component_w_index(ecs_entity_info_t *info,int32_t index)

{
  short sVar1;
  int16_t offset;
  ecs_data_t *peVar2;
  ecs_vector_t *vector;
  ecs_column_t *peVar3;
  void *pvVar4;
  void *ptr;
  int16_t size;
  ecs_vector_t *data_vec;
  ecs_column_t *column;
  ecs_column_t *columns;
  ecs_data_t *data;
  int32_t index_local;
  ecs_entity_info_t *info_local;
  
  peVar2 = info->data;
  _ecs_assert(peVar2 != (ecs_data_t *)0x0,0xc,(char *)0x0,"data != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x13);
  if (peVar2 == (ecs_data_t *)0x0) {
    __assert_fail("data != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x13,"void *get_component_w_index(ecs_entity_info_t *, int32_t)");
  }
  peVar3 = peVar2->columns;
  _ecs_assert(peVar3 != (ecs_column_t *)0x0,0xc,(char *)0x0,"columns != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x16);
  if (peVar3 == (ecs_column_t *)0x0) {
    __assert_fail("columns != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x16,"void *get_component_w_index(ecs_entity_info_t *, int32_t)");
  }
  _ecs_assert(index < info->table->column_count,3,(char *)0x0,"index < info->table->column_count",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x17);
  if (info->table->column_count <= index) {
    __assert_fail("index < info->table->column_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x17,"void *get_component_w_index(ecs_entity_info_t *, int32_t)");
  }
  peVar3 = peVar3 + index;
  vector = peVar3->data;
  sVar1 = peVar3->size;
  _ecs_assert(sVar1 != 0,2,(char *)0x0,"size != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x1f);
  if (sVar1 != 0) {
    _ecs_assert(vector != (ecs_vector_t *)0x0,0xc,(char *)0x0,"data_vec != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x24);
    if (vector == (ecs_vector_t *)0x0) {
      __assert_fail("data_vec != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x24,"void *get_component_w_index(ecs_entity_info_t *, int32_t)");
    }
    if (peVar3->alignment < 0x10) {
      offset = 0x10;
    }
    else {
      offset = peVar3->alignment;
    }
    pvVar4 = _ecs_vector_first(vector,(int)sVar1,offset);
    _ecs_assert(pvVar4 != (void *)0x0,0xc,(char *)0x0,"ptr != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x2a);
    if (pvVar4 != (void *)0x0) {
      return (void *)((long)pvVar4 + (long)(info->row * (int)sVar1));
    }
    __assert_fail("ptr != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x2a,"void *get_component_w_index(ecs_entity_info_t *, int32_t)");
  }
  __assert_fail("size != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x1f,"void *get_component_w_index(ecs_entity_info_t *, int32_t)");
}

Assistant:

static 
void* get_component_w_index(
    ecs_entity_info_t *info,
    int32_t index)
{
    ecs_data_t *data = info->data;
    ecs_assert(data != NULL, ECS_INTERNAL_ERROR, NULL);

    ecs_column_t *columns = data->columns;
    ecs_assert(columns != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(index < info->table->column_count, ECS_INVALID_COMPONENT_ID, NULL);

    ecs_column_t *column = &columns[index];
    ecs_vector_t *data_vec = column->data;
    int16_t size = column->size; 
    
    /* If size is 0, component does not have a value. This is likely caused by
     * an application trying to call ecs_get with a tag. */
    ecs_assert(size != 0, ECS_INVALID_PARAMETER, NULL);

    /* This function should not be called if an entity does not exist in the
     * provided table. Therefore if the component is found in the table, and an
     * entity exists for it, the vector cannot be NULL */
    ecs_assert(data_vec != NULL, ECS_INTERNAL_ERROR, NULL);

    void *ptr = ecs_vector_first_t(data_vec, size, column->alignment);

    /* This could only happen when the vector is empty, which should not be
     * possible since the vector should at least have one element */
    ecs_assert(ptr != NULL, ECS_INTERNAL_ERROR, NULL);

    return ECS_OFFSET(ptr, info->row * size);
}